

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

void xmlSetListDoc(xmlNodePtr list,xmlDocPtr doc)

{
  if ((list != (xmlNodePtr)0x0) && (list->type != XML_NAMESPACE_DECL)) {
    do {
      if (list->doc != doc) {
        xmlSetTreeDoc(list,doc);
      }
      list = list->next;
    } while (list != (_xmlNode *)0x0);
  }
  return;
}

Assistant:

void
xmlSetListDoc(xmlNodePtr list, xmlDocPtr doc) {
    xmlNodePtr cur;

    if ((list == NULL) || (list->type == XML_NAMESPACE_DECL))
	return;
    cur = list;
    while (cur != NULL) {
	if (cur->doc != doc)
	    xmlSetTreeDoc(cur, doc);
	cur = cur->next;
    }
}